

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O1

int bsearch_mapped_blocks(uc_engine *uc,uint64_t address)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  
  uVar3 = uc->mapped_block_count;
  if ((int)uVar3 < 1) {
    return 0;
  }
  iVar2 = 0;
  do {
    uVar1 = (int)(uVar3 - iVar2) / 2 + iVar2;
    if (uc->mapped_blocks[(int)uVar1]->end - 1 < address) {
      iVar2 = uVar1 + 1;
    }
    else {
      uVar3 = uVar1;
      if (uc->mapped_blocks[(int)uVar1]->addr <= address) {
        return uVar1;
      }
    }
  } while (iVar2 < (int)uVar3);
  return iVar2;
}

Assistant:

static int bsearch_mapped_blocks(const uc_engine *uc, uint64_t address)
{
    int left, right, mid;
    MemoryRegion *mapping;

    left = 0;
    right = uc->mapped_block_count;

    while (left < right) {
        mid = left + (right - left) / 2;

        mapping = uc->mapped_blocks[mid];

        if (mapping->end - 1 < address) {
            left = mid + 1;
        } else if (mapping->addr > address) {
            right = mid;
        } else {
            return mid;
        }
    }

    return left;
}